

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O2

IndexStorageInfo * __thiscall
duckdb::ART::GetStorageInfo
          (IndexStorageInfo *__return_storage_ptr__,ART *this,case_insensitive_map_t<Value> *options
          ,bool to_wal)

{
  vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_true> *this_00;
  shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
  *this_01;
  IndexStorageInfo *pIVar1;
  bool bVar2;
  const_iterator cVar3;
  type paVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  allocator local_b9;
  IndexStorageInfo *local_b8;
  FixedSizeAllocatorInfo local_b0;
  
  ::std::__cxx11::string::string((string *)&local_b0,"v1_0_0_storage",&local_b9);
  cVar3 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&options->_M_h,(key_type *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_b0);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
      ._M_cur != (__node_type *)0x0) {
    Value::Value((Value *)&local_b0,false);
    bVar2 = Value::operator!=((Value *)((long)cVar3.
                                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                                              ._M_cur + 0x28),(Value *)&local_b0);
    Value::~Value((Value *)&local_b0);
    if (!bVar2) {
      bVar2 = false;
      goto LAB_01a225cd;
    }
  }
  TransformToDeprecated(this);
  bVar2 = true;
LAB_01a225cd:
  IndexStorageInfo::IndexStorageInfo(__return_storage_ptr__,&(this->super_BoundIndex).name);
  __return_storage_ptr__->root = (this->tree).super_IndexPointer.data;
  local_b8 = __return_storage_ptr__;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&(__return_storage_ptr__->options)._M_h,&options->_M_h);
  this_01 = &this->allocators;
  paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(this_01);
  for (lVar5 = 0; pIVar1 = local_b8, lVar5 != 0x48; lVar5 = lVar5 + 8) {
    FixedSizeAllocator::RemoveEmptyBuffers
              (*(FixedSizeAllocator **)
                ((long)&paVar4->_M_elems[0].
                        super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                        .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> + lVar5));
  }
  uVar6 = (ulong)((uint)(bVar2 == false) * 3 + 6);
  if (to_wal) {
    this_00 = &local_b8->buffers;
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(this_01);
      FixedSizeAllocator::InitSerializationToWAL
                ((vector<duckdb::IndexBufferInfo,_true> *)&local_b0,
                 (FixedSizeAllocator *)
                 paVar4->_M_elems[uVar7].
                 super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                 .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>);
      ::std::
      vector<duckdb::vector<duckdb::IndexBufferInfo,true>,std::allocator<duckdb::vector<duckdb::IndexBufferInfo,true>>>
      ::emplace_back<duckdb::vector<duckdb::IndexBufferInfo,true>>
                ((vector<duckdb::vector<duckdb::IndexBufferInfo,true>,std::allocator<duckdb::vector<duckdb::IndexBufferInfo,true>>>
                  *)this_00,(vector<duckdb::IndexBufferInfo,_true> *)&local_b0);
      ::std::_Vector_base<duckdb::IndexBufferInfo,_std::allocator<duckdb::IndexBufferInfo>_>::
      ~_Vector_base((_Vector_base<duckdb::IndexBufferInfo,_std::allocator<duckdb::IndexBufferInfo>_>
                     *)&local_b0);
    }
  }
  else {
    WritePartialBlocks(this,bVar2);
  }
  for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(this_01);
    FixedSizeAllocator::GetInfo
              (&local_b0,
               (FixedSizeAllocator *)
               paVar4->_M_elems[uVar7].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>);
    ::std::vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>::
    emplace_back<duckdb::FixedSizeAllocatorInfo>
              (&(pIVar1->allocator_infos).
                super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
               ,&local_b0);
    FixedSizeAllocatorInfo::~FixedSizeAllocatorInfo(&local_b0);
  }
  return pIVar1;
}

Assistant:

IndexStorageInfo ART::GetStorageInfo(const case_insensitive_map_t<Value> &options, const bool to_wal) {
	// If the storage format uses deprecated leaf storage,
	// then we need to transform all nested leaves before serialization.
	auto v1_0_0_option = options.find("v1_0_0_storage");
	bool v1_0_0_storage = v1_0_0_option == options.end() || v1_0_0_option->second != Value(false);
	if (v1_0_0_storage) {
		TransformToDeprecated();
	}

	IndexStorageInfo info(name);
	info.root = tree.Get();
	info.options = options;

	for (auto &allocator : *allocators) {
		allocator->RemoveEmptyBuffers();
	}

#ifdef DEBUG
	if (v1_0_0_storage) {
		D_ASSERT((*allocators)[Node::GetAllocatorIdx(NType::NODE_7_LEAF)]->Empty());
		D_ASSERT((*allocators)[Node::GetAllocatorIdx(NType::NODE_15_LEAF)]->Empty());
		D_ASSERT((*allocators)[Node::GetAllocatorIdx(NType::NODE_256_LEAF)]->Empty());
		D_ASSERT((*allocators)[Node::GetAllocatorIdx(NType::PREFIX)]->GetSegmentSize() ==
		         Prefix::DEPRECATED_COUNT + Prefix::METADATA_SIZE);
	}
#endif

	auto allocator_count = v1_0_0_storage ? DEPRECATED_ALLOCATOR_COUNT : ALLOCATOR_COUNT;
	if (!to_wal) {
		// Store the data on disk as partial blocks and set the block ids.
		WritePartialBlocks(v1_0_0_storage);

	} else {
		// Set the correct allocation sizes and get the map containing all buffers.
		for (idx_t i = 0; i < allocator_count; i++) {
			info.buffers.push_back((*allocators)[i]->InitSerializationToWAL());
		}
	}

	for (idx_t i = 0; i < allocator_count; i++) {
		info.allocator_infos.push_back((*allocators)[i]->GetInfo());
	}
	return info;
}